

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exls_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  MAFSA_automaton out;
  char *sz_out;
  char dbg [4096];
  timeval tvs2;
  timeval tvs1;
  size_t urlsz;
  size_t outsz;
  char *pos;
  char urlbuf [4096];
  MAFSA_letter outbuf [1024];
  timeval tvc2;
  timeval tvc1;
  MAFSA_letter word [1024];
  size_t sz;
  uint32_t ss;
  uint32_t cs;
  uint32_t ok;
  uint32_t ex;
  int rc;
  int i;
  MAFSA_automaton ma;
  daciuk<256> dict;
  char *in_stack_ffffffffffffd690;
  size_t *in_stack_ffffffffffffd6b0;
  char *in_stack_ffffffffffffd6b8;
  daciuk<256> *in_stack_ffffffffffffd6c0;
  u_char **in_stack_ffffffffffffd6c8;
  MAFSA_letter *in_stack_ffffffffffffd6d0;
  MAFSA_automaton in_stack_ffffffffffffd6d8;
  char *in_stack_ffffffffffffd6f0;
  daciuk<256> *in_stack_ffffffffffffd6f8;
  size_t in_stack_ffffffffffffd758;
  MAFSA_letter *in_stack_ffffffffffffd760;
  daciuk<256> *in_stack_ffffffffffffd768;
  timeval local_1920;
  timeval local_1910;
  size_t local_1900;
  long local_18f8;
  char *local_18f0;
  char local_18e8 [4096];
  undefined1 local_8e8 [1040];
  timeval local_4d8;
  timeval local_4c8;
  MAFSA_letter local_4b8 [1024];
  size_t local_b8;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  int local_9c;
  MAFSA_automaton local_98;
  int local_4;
  
  local_4 = 0;
  MAFSA::daciuk<256>::daciuk(in_stack_ffffffffffffd6c0);
  local_a4 = 0;
  local_a8 = 0;
  local_ac = 0;
  local_b0 = 0;
  for (local_9c = 0; urls[local_9c] != (u_char *)0x0; local_9c = local_9c + 1) {
    in_stack_ffffffffffffd6c8 = urls;
    local_b8 = strlen((char *)urls[local_9c]);
    in_stack_ffffffffffffd6d0 = local_4b8;
    memcpy(in_stack_ffffffffffffd6d0,in_stack_ffffffffffffd6c8[local_9c],local_b8);
    gettimeofday(&local_4c8,(__timezone_ptr_t)0x0);
    MAFSA::daciuk<256>::insert
              (in_stack_ffffffffffffd768,in_stack_ffffffffffffd760,in_stack_ffffffffffffd758);
    gettimeofday(&local_4d8,(__timezone_ptr_t)0x0);
    local_ac = local_ac +
               ((int)local_4d8.tv_sec - (int)local_4c8.tv_sec) * 1000000 +
               ((int)local_4d8.tv_usec - (int)local_4c8.tv_usec);
  }
  MAFSA::daciuk<256>::save_to_file(in_stack_ffffffffffffd6f8,in_stack_ffffffffffffd6f0);
  out = MAFSA_automaton_load_from_binary_file
                  (in_stack_ffffffffffffd6b8,(int *)in_stack_ffffffffffffd6b0);
  local_98 = out;
  while( true ) {
    local_18f8 = 0;
    local_1900 = 0;
    sz_out = fgets(local_18e8,0x1000,_stdin);
    if (sz_out == (char *)0x0) break;
    local_18f0 = strchr(local_18e8,10);
    if (local_18f0 != (char *)0x0) {
      *local_18f0 = '\0';
    }
    local_18f0 = strchr(local_18e8,0xd);
    if (local_18f0 != (char *)0x0) {
      *local_18f0 = '\0';
    }
    local_1900 = strlen(local_18e8);
    gettimeofday(&local_1910,(__timezone_ptr_t)0x0);
    in_stack_ffffffffffffd6b0 =
         (size_t *)
         MAFSA_automaton_search
                   (in_stack_ffffffffffffd6d8,in_stack_ffffffffffffd6d0,
                    (size_t)in_stack_ffffffffffffd6c8,(MAFSA_letter *)out,(size_t)sz_out,
                    in_stack_ffffffffffffd6b0);
    local_a0 = (uint)in_stack_ffffffffffffd6b0;
    gettimeofday(&local_1920,(__timezone_ptr_t)0x0);
    local_b0 = local_b0 +
               ((int)local_1920.tv_sec - (int)local_1910.tv_sec) * 1000000 +
               ((int)local_1920.tv_usec - (int)local_1910.tv_usec);
    if (local_a0 == 0xffffffff) {
      local_a8 = local_a8 + 1;
    }
    else {
      local_a4 = local_a4 + 1;
      in_stack_ffffffffffffd690 = "%s";
      local_18f0 = &stack0xffffffffffffd6d8;
      snprintf(&stack0xffffffffffffd6d8,(long)(int)(local_a0 + 1),"%s",local_18e8);
      local_18f0 = local_18f0 + (int)local_a0;
      snprintf(local_18f0,8,"\x1b[1;31m");
      local_18f0 = local_18f0 + 7;
      snprintf(local_18f0,local_18f8 + 1,in_stack_ffffffffffffd690,local_8e8);
      local_18f0 = local_18f0 + local_18f8;
      snprintf(local_18f0,5,"\x1b[0m");
      local_18f0 = local_18f0 + 4;
      snprintf(local_18f0,((local_1900 - local_18f8) - (long)(int)local_a0) + 1,
               in_stack_ffffffffffffd690,local_18e8 + local_18f8 + (int)local_a0);
      printf("Filter (%03d .. %03u): %s\n",(ulong)local_a0,(ulong)(local_a0 + (int)local_18f8),
             &stack0xffffffffffffd6d8);
    }
  }
  printf("\n");
  printf("Result: ex = %d, ok = %d\n",(ulong)local_a4,(ulong)local_a8);
  printf("TimeComple: %6u.%06u seconds\n",(ulong)(local_ac / 1000000),(ulong)(local_ac % 1000000));
  printf("TimeSearch: %6u.%06u seconds\n",(ulong)(local_b0 / 1000000),(ulong)(local_b0 % 1000000));
  MAFSA_automaton_close((MAFSA_automaton)0x10c8a8);
  local_4 = 0;
  MAFSA::daciuk<256>::~daciuk((daciuk<256> *)in_stack_ffffffffffffd690);
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{
    MAFSA::daciuk<MAX_LETTER + 1> dict;
    MAFSA_automaton ma;

    int i;
    int rc;

    uint32_t ex = 0, ok = 0;
    uint32_t cs = 0, ss = 0;

    for (i = 0; urls[i]; ++i)
    {
        size_t sz;
        MAFSA_letter word [1024];

        struct timeval tvc1;
        struct timeval tvc2;

        sz = strlen((const char *) urls[i]);
        memcpy(word, urls[i], sz);

        gettimeofday(&tvc1, NULL);
        dict.insert(word, sz);
        gettimeofday(&tvc2, NULL);

        cs += (tvc2.tv_sec - tvc1.tv_sec) * 1000000 + (tvc2.tv_usec - tvc1.tv_usec);
    }

    dict.save_to_file(SAVE_TO);
    ma = MAFSA_automaton_load_from_binary_file(SAVE_TO, NULL);

    for (;;)
    {
        MAFSA_letter outbuf [1024];
        char urlbuf [4096], *pos;
        size_t outsz = 0, urlsz = 0;

        struct timeval tvs1;
        struct timeval tvs2;

        if (NULL == fgets(urlbuf, 4096, stdin))
        {
            break;
        }

        if (NULL != (pos = strchr(urlbuf, '\n'))) *pos = 0;
        if (NULL != (pos = strchr(urlbuf, '\r'))) *pos = 0;

        urlsz = strlen(urlbuf);

        gettimeofday(&tvs1, NULL);
        rc = MAFSA_automaton_search(ma, (const MAFSA_letter *) urlbuf, urlsz, outbuf, 1024, &outsz);
        gettimeofday(&tvs2, NULL);

        ss += (tvs2.tv_sec - tvs1.tv_sec) * 1000000 + (tvs2.tv_usec - tvs1.tv_usec);

        if (-1 == rc)
        {
            ++ok;
        }
        else
        {
            char dbg [4096];

            ++ex;
            pos = dbg;

            snprintf(pos, rc + 1, "%s", urlbuf);
            pos += rc;

            snprintf(pos, sizeof("\033[1;31m"), "\033[1;31m");
            pos += sizeof("\033[1;31m") - 1;

            snprintf(pos, outsz + 1, "%s", outbuf);
            pos += outsz;

            snprintf(pos, sizeof("\033[0m"), "\033[0m");
            pos += sizeof("\033[0m") - 1;

            snprintf(pos, urlsz - outsz - rc + 1, "%s", urlbuf + rc + outsz);
            printf("Filter (%03d .. %03u): %s\n", rc, (unsigned int) (rc + outsz), dbg);
        }
    }

    printf("\n");
    printf("Result: ex = %d, ok = %d\n", ex, ok);
    printf("TimeComple: %6u.%06u seconds\n", cs / 1000000, cs % 1000000);
    printf("TimeSearch: %6u.%06u seconds\n", ss / 1000000, ss % 1000000);

    MAFSA_automaton_close(ma);

    return 0;
}